

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  bool bVar1;
  CppType CVar2;
  char *pcVar3;
  byte in_R8B;
  string type;
  string cardinality;
  FieldDescriptor *in_stack_00000148;
  string default_arg;
  string with_default;
  bool is_boolean;
  bool is_float_or_double;
  string *in_stack_fffffffffffffdc8;
  AlphaNum *in_stack_fffffffffffffdd0;
  allocator *field_00;
  bool local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  AlphaNum *in_stack_fffffffffffffe70;
  AlphaNum *in_stack_fffffffffffffe78;
  char (*in_stack_fffffffffffffe80) [12];
  char *in_stack_fffffffffffffe88;
  Printer *in_stack_fffffffffffffe90;
  char (*in_stack_fffffffffffffea0) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  string local_150 [32];
  char (*in_stack_fffffffffffffed0) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  char (*in_stack_fffffffffffffee0) [4];
  char **in_stack_fffffffffffffee8;
  char (*in_stack_fffffffffffffef0) [6];
  undefined5 in_stack_fffffffffffffef8;
  byte bVar4;
  allocator in_stack_fffffffffffffefe;
  byte bVar5;
  char (*in_stack_ffffffffffffff00) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_80 [55];
  allocator local_49;
  string local_48 [37];
  byte local_23;
  bool local_22;
  byte local_21;
  
  local_21 = in_R8B & 1;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x469b50);
  local_199 = true;
  if (CVar2 != CPPTYPE_FLOAT) {
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x469b6d);
    local_199 = CVar2 == CPPTYPE_DOUBLE;
  }
  local_22 = local_199;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x469b97);
  local_23 = CVar2 == CPPTYPE_BOOL;
  pcVar3 = "";
  if ((local_21 & 1) != 0) {
    pcVar3 = "WithDefault";
  }
  field_00 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar3,field_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar5 = 0;
  bVar4 = 0;
  if ((local_21 & 1) == 0) {
    std::allocator<char>::allocator();
    bVar4 = 1;
    std::__cxx11::string::string(local_80,"",(allocator *)&stack0xfffffffffffffefe);
  }
  else {
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_(in_stack_00000148);
    bVar5 = 1;
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    StrCat_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  }
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffefe);
  }
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x469d0b);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "Repeated";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffed8,pcVar3,(allocator *)&stack0xfffffffffffffed7);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"",(allocator *)&stack0xfffffffffffffeaf);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
  if ((local_22 & 1U) != 0) {
    std::__cxx11::string::operator=(local_150,"FloatingPoint");
  }
  if ((local_23 & 1) != 0) {
    std::__cxx11::string::operator=(local_150,"Boolean");
  }
  if ((((local_22 & 1U) == 0) ||
      (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x469f27), bVar1)) ||
     ((local_21 & 1) != 0)) {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)field_00);
    io::Printer::
    Print<char[12],std::__cxx11::string,char[5],std::__cxx11::string,char[13],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe78,(char (*) [5])in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffefe,
                                       CONCAT15(bVar4,in_stack_fffffffffffffef8))),
               in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  else {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)field_00);
    io::Printer::
    Print<char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (char (*) [4])in_stack_fffffffffffffe80,&in_stack_fffffffffffffe78->piece_data_,
               (char (*) [6])in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
  }
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char* obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  const bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  const bool is_boolean = field->cpp_type() == FieldDescriptor::CPPTYPE_BOOL;

  const string with_default = use_default ? "WithDefault" : "";
  const string default_arg =
      use_default ? StrCat(", ", JSFieldDefault(field)) : "";
  const string cardinality = field->is_repeated() ? "Repeated" : "";
  string type = "";
  if (is_float_or_double) {
    type = "FloatingPoint";
  }
  if (is_boolean) {
    type = "Boolean";
  }

  // Prints the appropriate function, among:
  // - getField
  // - getBooleanField
  // - getFloatingPointField => Replaced by getOptionalFloatingPointField to
  //   preserve backward compatibility.
  // - getFieldWithDefault
  // - getBooleanFieldWithDefault
  // - getFloatingPointFieldWithDefault
  // - getRepeatedField
  // - getRepeatedBooleanField
  // - getRepeatedFloatingPointField
  if (is_float_or_double && !field->is_repeated() && !use_default) {
    printer->Print(
        "jspb.Message.getOptionalFloatingPointField($obj$, "
        "$index$$default$)",
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  } else {
    printer->Print(
        "jspb.Message.get$cardinality$$type$Field$with_default$($obj$, "
        "$index$$default$)",
        "cardinality", cardinality, "type", type, "with_default", with_default,
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  }
}